

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuiteTest.h
# Opt level: O2

void __thiscall
oout::SuiteTest::
SuiteTest<oout::Test_const,oout::ContainTest,oout::ContainTest,oout::ContainTest,oout::ContainTest>
          (SuiteTest *this,shared_ptr<const_oout::Test> *test1,shared_ptr<const_oout::Test> *tests,
          shared_ptr<oout::ContainTest> *tests_1,shared_ptr<oout::ContainTest> *tests_2,
          shared_ptr<oout::ContainTest> *tests_3,shared_ptr<oout::ContainTest> *tests_4)

{
  long lVar1;
  initializer_list<std::shared_ptr<const_oout::Test>_> __l;
  allocator_type local_a9;
  _List_base<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
  local_a8;
  __shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2> local_70 [16];
  __shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2> local_60 [16];
  __shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2> local_50 [16];
  __shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2> local_40 [16];
  
  std::__shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_90,&test1->super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_80,&tests->super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<oout::ContainTest,void>
            (local_70,&tests_1->super___shared_ptr<oout::ContainTest,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<oout::ContainTest,void>
            (local_60,&tests_2->super___shared_ptr<oout::ContainTest,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<oout::ContainTest,void>
            (local_50,&tests_3->super___shared_ptr<oout::ContainTest,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<oout::ContainTest,void>
            (local_40,&tests_4->super___shared_ptr<oout::ContainTest,_(__gnu_cxx::_Lock_policy)2>);
  __l._M_len = 6;
  __l._M_array = (iterator)&local_90;
  std::__cxx11::
  list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>::list
            ((list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
              *)&local_a8,__l,&local_a9);
  SuiteTest(this,(list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
                  *)&local_a8);
  std::__cxx11::
  _List_base<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
  ::_M_clear(&local_a8);
  lVar1 = 0x58;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&local_90._M_ptr + lVar1));
    lVar1 = lVar1 + -0x10;
  } while (lVar1 != -8);
  return;
}

Assistant:

explicit SuiteTest(
			const std::shared_ptr<const Test> &test1,
			const std::shared_ptr<T> & ... tests
		) : SuiteTest(std::list<std::shared_ptr<const Test>>{
			test1, tests...
		})
	{
	}